

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  size_t __size;
  void *__s1;
  char *pcVar5;
  double dVar6;
  double dVar7;
  undefined8 uStackY_70;
  char *pcVar8;
  undefined1 local_48 [32];
  
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  minunit_assert = minunit_assert + 1;
  putchar(0x2e);
  minunit_run = minunit_run + 1;
  if (minunit_status == '\x01') {
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  lVar3 = labpack_writer_create();
  minunit_assert = minunit_assert + 1;
  if (lVar3 == 0) {
    pcVar8 = "Writer is NULL";
    uStackY_70 = 0x4d;
LAB_00102684:
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_writer_create_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,uStackY_70,pcVar8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_0010269f:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar2 = labpack_writer_status(lVar3);
    if (iVar2 != 0) {
      pcVar8 = "Writer is not OK";
      uStackY_70 = 0x4e;
      goto LAB_00102684;
    }
    putchar(0x2e);
    labpack_writer_destroy(lVar3);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_0010269f;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  uVar4 = labpack_writer_create();
  labpack_writer_destroy(uVar4);
  minunit_run = minunit_run + 1;
  if (minunit_status == '\x01') {
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  minunit_setup = setup;
  minunit_teardown = teardown;
  if ((((minunit_real_timer != 0.0) || (NAN(minunit_real_timer))) || (minunit_proc_timer != 0.0)) ||
     (NAN(minunit_proc_timer))) {
LAB_001027ea:
    (*minunit_setup)();
  }
  else {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
    if (minunit_setup != (_func_void *)0x0) goto LAB_001027ea;
  }
  minunit_status = '\0';
  labpack_writer_begin(writer);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_writer_begin_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x5b,"Failed to begin writer");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_0010287f:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    labpack_writer_end(writer);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_0010287f;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_writer_begin(writer);
  labpack_writer_end(writer);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_writer_end_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,99,"Failed to end writer");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00102998:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00102998;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  minunit_setup = setup;
  minunit_teardown = teardown;
  if (((minunit_real_timer != 0.0) || (NAN(minunit_real_timer))) ||
     ((minunit_proc_timer != 0.0 || (NAN(minunit_proc_timer))))) {
LAB_00102a31:
    (*minunit_setup)();
  }
  else {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
    if (minunit_setup != (_func_void *)0x0) goto LAB_00102a31;
  }
  minunit_status = '\0';
  labpack_writer_begin(writer);
  labpack_write_object_bytes(writer,MSGPACK_HOME_PAGE_EXAMPLE_OUTPUT,0x12);
  labpack_writer_end(writer);
  lVar3 = labpack_writer_buffer_size(writer);
  minunit_assert = minunit_assert + 1;
  if (lVar3 == 0x12) {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00102ae0;
  }
  else {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_writer_buffer_size_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x80,"Actual value does not match expected value");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00102ae0:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_writer_begin(writer);
  labpack_write_object_bytes(writer,MSGPACK_HOME_PAGE_EXAMPLE_OUTPUT,0x12);
  lVar3 = labpack_writer_buffer_size(writer);
  minunit_assert = minunit_assert + 1;
  if (lVar3 == 0) {
    putchar(0x2e);
    labpack_writer_end(writer);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00102c12;
  }
  else {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s",
             "test_writer_buffer_size_works_without_end",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x88,"Actual value does not match expected value");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00102c12:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_writer_begin(writer);
  labpack_write_object_bytes(writer,MSGPACK_HOME_PAGE_EXAMPLE_OUTPUT,0x12);
  labpack_writer_end(writer);
  __size = labpack_writer_buffer_size(writer);
  __s1 = malloc(__size);
  labpack_writer_buffer_data(writer,__s1);
  minunit_assert = minunit_assert + 1;
  iVar2 = bcmp(__s1,MSGPACK_HOME_PAGE_EXAMPLE_OUTPUT,__size);
  if (iVar2 == 0) {
    putchar(0x2e);
    free(__s1);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00102d79;
  }
  else {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_writer_buffer_data_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x94,"Actual value does not match expected value");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00102d79:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_writer_begin(writer);
  labpack_write_object_bytes(writer,MSGPACK_HOME_PAGE_EXAMPLE_OUTPUT,0x12);
  labpack_writer_buffer_data(writer,local_48);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_error(writer);
  if (cVar1 == '\0') {
    pcVar8 = "Does not error when it should";
    uVar4 = 0x9e;
LAB_00102efd:
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s",
             "test_writer_buffer_data_errors_without_end",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,uVar4,pcVar8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00102f11:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar2 = labpack_writer_status(writer);
    if (iVar2 != 3) {
      pcVar8 = "Error status is not correct";
      uVar4 = 0x9f;
      goto LAB_00102efd;
    }
    putchar(0x2e);
    labpack_writer_end(writer);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00102f11;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_writer_begin(writer);
  labpack_write_object_bytes(writer,MSGPACK_HOME_PAGE_EXAMPLE_OUTPUT,0x12);
  labpack_writer_buffer_data(writer,0);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_error(writer);
  if (cVar1 == '\0') {
    pcVar8 = "Does not error when it should";
    uVar4 = 0xa8;
LAB_00103092:
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s",
             "test_writer_buffer_data_errors_with_null",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,uVar4,pcVar8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_001030a6:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar2 = labpack_writer_status(writer);
    if (iVar2 != 2) {
      pcVar8 = "Error status is not correct";
      uVar4 = 0xa9;
      goto LAB_00103092;
    }
    putchar(0x2e);
    labpack_writer_end(writer);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_001030a6;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  minunit_setup = setup;
  minunit_teardown = teardown;
  if (((minunit_real_timer != 0.0) || (NAN(minunit_real_timer))) ||
     ((minunit_proc_timer != 0.0 || (NAN(minunit_proc_timer))))) {
LAB_0010313f:
    (*minunit_setup)();
  }
  else {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
    if (minunit_setup != (_func_void *)0x0) goto LAB_0010313f;
  }
  minunit_status = '\0';
  minunit_assert = minunit_assert + 1;
  iVar2 = labpack_writer_status(writer);
  if (iVar2 == 0) {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_001031bc;
  }
  else {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_writer_status_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x68,"Writer status is not OK");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_001031bc:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  pcVar5 = (char *)labpack_writer_status_message(writer);
  minunit_assert = minunit_assert + 1;
  pcVar8 = "<null pointer>";
  if (pcVar5 != (char *)0x0) {
    pcVar8 = pcVar5;
  }
  iVar2 = strcmp("No Error",pcVar8);
  if (iVar2 == 0) {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_001032db;
  }
  else {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: \'%s\' expected but was \'%s\'",
             "test_writer_status_message_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x6d,"No Error",pcVar8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_001032db:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_writer_is_ok_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x72,"Writer is not OK");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_001033dc:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_001033dc;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_error(writer);
  if (cVar1 == '\0') {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_001034dd;
  }
  else {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_writer_is_error_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x77,"Writer is unexpectedly OK");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_001034dd:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  minunit_setup = before_each;
  minunit_teardown = after_each;
  if (((minunit_real_timer != 0.0) || (NAN(minunit_real_timer))) ||
     ((minunit_proc_timer != 0.0 || (NAN(minunit_proc_timer))))) {
LAB_0010357d:
    (*minunit_setup)();
  }
  else {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
    if (minunit_setup != (_func_void *)0x0) goto LAB_0010357d;
  }
  minunit_status = '\0';
  labpack_write_i8(writer,0x7f);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_i8_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0xb0,"Failed to write i8");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_0010360b:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_0010360b;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_i16(writer,0x7fff);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_i16_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0xb6,"Failed to write i16");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_0010371f:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_0010371f;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_i32(writer,0x7fffffff);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_i32_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0xbc,"Failed to write i32");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00103833:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00103833;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_i64(writer,0x80000000);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_i64_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0xc2,"Failed to write i64");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00103947:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00103947;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_int(writer,0x7b);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_int_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,200,"Failed to write int");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00103a59:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00103a59;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_u8(writer,0x7f);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_u8_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0xce,"Failed to write u8");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00103b6b:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00103b6b;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_u16(writer,0x7fff);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_u16_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0xd4,"Failed to write u16");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00103c7f:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00103c7f;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_u32(writer,0x7fffffff);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_u32_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0xda,"Failed to write u32");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00103d93:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00103d93;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_u64(writer,0x80000000);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_u64_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0xe0,"Failed to write u64");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00103ea7:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00103ea7;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_uint(writer,0x499602d2);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_uint_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0xe6,"Failed to write uint");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00103fbb:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00103fbb;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_float(0x3f9e0652,writer);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_float_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0xec,"Failed to write float");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_001040d2:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_001040d2;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_double(0x3ff3c0ca4283de1b,writer);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_double_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0xf2,"Failed to write double");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_001041e9:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_001041e9;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_bool(writer,1);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_bool_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0xf8,"Failed to write bool");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_001042fb:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_001042fb;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_true(writer);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_true_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0xfe,"Failed to write true");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_0010440a:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_0010440a;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_false(writer);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_false_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x104,"Failed to write false");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00104519:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00104519;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_nil(writer);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_nil_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x10a,"Failed to write nil");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00104628:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00104628;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_object_bytes(writer,MSGPACK_HOME_PAGE_EXAMPLE_OUTPUT,0x12);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_object_bytes_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x110,"Failed to write object");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00104741:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00104741;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_object_bytes(writer,0,0);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s",
             "test_write_object_bytes_works_with_null_data",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x116,"Failed to write object");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00104854:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00104854;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_object_bytes(writer,0,10);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_error(writer);
  if (cVar1 == '\0') {
    pcVar8 = "Does not error when it should";
    uVar4 = 0x11c;
LAB_001049aa:
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s",
             "test_write_object_bytes_errors_with_wrong_size",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,uVar4,pcVar8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_001049be:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar2 = labpack_writer_status(writer);
    if (iVar2 != 2) {
      pcVar8 = "Error status is not correct";
      uVar4 = 0x11d;
      goto LAB_001049aa;
    }
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_001049be;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  minunit_setup = before_each;
  minunit_teardown = after_each;
  if ((((minunit_real_timer != 0.0) || (NAN(minunit_real_timer))) || (minunit_proc_timer != 0.0)) ||
     (NAN(minunit_proc_timer))) {
LAB_00104a57:
    (*minunit_setup)();
  }
  else {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
    if (minunit_setup != (_func_void *)0x0) goto LAB_00104a57;
  }
  minunit_status = '\0';
  labpack_writer_begin_array(writer,0);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    pcVar8 = "Failed to begin array";
    uVar4 = 0x123;
LAB_00104b31:
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_begin_and_end_array_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,uVar4,pcVar8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00104b45:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    labpack_writer_end_array(writer);
    minunit_assert = minunit_assert + 1;
    cVar1 = labpack_writer_is_ok(writer);
    if (cVar1 == '\0') {
      pcVar8 = "Failed to end array";
      uVar4 = 0x125;
      goto LAB_00104b31;
    }
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00104b45;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_writer_begin_map(writer,0);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    pcVar8 = "Failed to begin map";
    uVar4 = 299;
LAB_00104ca3:
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_begin_and_end_map_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,uVar4,pcVar8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00104cb7:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    labpack_writer_end_map(writer);
    minunit_assert = minunit_assert + 1;
    cVar1 = labpack_writer_is_ok(writer);
    if (cVar1 == '\0') {
      pcVar8 = "Failed to end map";
      uVar4 = 0x12d;
      goto LAB_00104ca3;
    }
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00104cb7;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  minunit_setup = before_each;
  minunit_teardown = after_each;
  if (((minunit_real_timer != 0.0) || (NAN(minunit_real_timer))) ||
     ((minunit_proc_timer != 0.0 || (NAN(minunit_proc_timer))))) {
LAB_00104d50:
    (*minunit_setup)();
  }
  else {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
    if (minunit_setup != (_func_void *)0x0) goto LAB_00104d50;
  }
  minunit_status = '\0';
  labpack_write_str(writer,"It\'s like JSON, but fast and small.",0x23);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_str_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x133,"Failed to write string");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00104de5:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00104de5;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_str(writer,0,0x23);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_error(writer);
  if (cVar1 == '\0') {
    pcVar8 = "Does not error when it should";
    uVar4 = 0x139;
LAB_00104f3b:
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s",
             "test_write_str_errors_with_wrong_size",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,uVar4,pcVar8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00104f4f:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar2 = labpack_writer_status(writer);
    if (iVar2 != 2) {
      pcVar8 = "Error status is not correct";
      uVar4 = 0x13a;
      goto LAB_00104f3b;
    }
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00104f4f;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_str(writer,"It\'s like JSON, but fast and small.",0x23);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_utf8_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x140,"Failed to write string");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00105068:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00105068;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_str(writer,0,0x23);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_error(writer);
  if (cVar1 == '\0') {
    pcVar8 = "Does not error when it should";
    uVar4 = 0x146;
LAB_001051be:
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s",
             "test_write_utf8_errors_with_wrong_size",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,uVar4,pcVar8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_001051d2:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar2 = labpack_writer_status(writer);
    if (iVar2 != 2) {
      pcVar8 = "Error status is not correct";
      uVar4 = 0x147;
      goto LAB_001051be;
    }
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_001051d2;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_cstr(writer,"It\'s like JSON, but fast and small.");
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_cstr_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x14d,"Failed to write string");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_001052e8:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_001052e8;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_cstr(writer,0);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_error(writer);
  if (cVar1 == '\0') {
    pcVar8 = "Does not error when it should";
    uVar4 = 0x153;
LAB_0010543b:
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s",
             "test_write_cstr_errors_with_null_value",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,uVar4,pcVar8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_0010544f:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar2 = labpack_writer_status(writer);
    if (iVar2 != 2) {
      pcVar8 = "Error status is not correct";
      uVar4 = 0x154;
      goto LAB_0010543b;
    }
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_0010544f;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_cstr_or_nil(writer,"It\'s like JSON, but fast and small.");
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_cstr_or_nil_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x15a,"Failed to write string");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00105565:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00105565;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_cstr_or_nil(writer,0);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s",
             "test_write_cstr_or_nil_works_with_null_value",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x160,"Failed to write string");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00105676:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00105676;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_utf8_cstr(writer,"It\'s like JSON, but fast and small.");
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_utf8_cstr_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x166,"Failed to write string");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_0010578c:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_0010578c;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_utf8_cstr(writer,0);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_error(writer);
  if (cVar1 == '\0') {
    pcVar8 = "Does not error when it should";
    uVar4 = 0x16c;
LAB_001058df:
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s",
             "test_write_utf8_cstr_errors_with_null_value",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,uVar4,pcVar8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_001058f3:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar2 = labpack_writer_status(writer);
    if (iVar2 != 2) {
      pcVar8 = "Error status is not correct";
      uVar4 = 0x16d;
      goto LAB_001058df;
    }
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_001058f3;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_utf8_cstr_or_nil(writer,"It\'s like JSON, but fast and small.");
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s",
             "test_write_utf8_cstr_or_nil_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x173,"Failed to write string");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00105a09:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00105a09;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_utf8_cstr_or_nil(writer,0);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s",
             "test_write_utf8_cstr_or_nil_works_with_null_value",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x179,"Failed to write string");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00105b1a:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00105b1a;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_bin(writer,"",4);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_bin_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x17f,"Failed to write binary data");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00105c33:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00105c33;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_bin(writer,0,0);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s",
             "test_write_bin_works_with_null_data",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x185,"Failed to write binary data");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00105d46:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00105d46;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_bin(writer,0,4);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_error(writer);
  if (cVar1 == '\0') {
    pcVar8 = "Does not error when it should";
    uVar4 = 0x18b;
LAB_00105e9c:
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s",
             "test_write_bin_errors_with_wrong_count",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,uVar4,pcVar8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00105eb0:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar2 = labpack_writer_status(writer);
    if (iVar2 != 2) {
      pcVar8 = "Error status is not correct";
      uVar4 = 0x18c;
      goto LAB_00105e9c;
    }
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00105eb0;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_ext(writer,2,"",4);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_ext_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x192,"Failed to write binary data");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00105fcc:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00105fcc;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_ext(writer,2,0,0);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s",
             "test_write_ext_works_with_null_data",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x198,"Failed to write binary data");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_001060e2:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_001060e2;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_write_ext(writer,2,0,4);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_error(writer);
  if (cVar1 == '\0') {
    pcVar8 = "Does not error when it should";
    uVar4 = 0x19f;
LAB_0010623b:
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s",
             "test_write_ext_errors_with_wrong_count",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,uVar4,pcVar8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_0010624f:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar2 = labpack_writer_status(writer);
    if (iVar2 != 2) {
      pcVar8 = "Error status is not correct";
      uVar4 = 0x1a0;
      goto LAB_0010623b;
    }
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_0010624f;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  minunit_setup = before_each;
  minunit_teardown = after_each;
  if (((minunit_real_timer != 0.0) || (NAN(minunit_real_timer))) ||
     ((minunit_proc_timer != 0.0 || (NAN(minunit_proc_timer))))) {
LAB_001062e8:
    (*minunit_setup)();
  }
  else {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
    if (minunit_setup != (_func_void *)0x0) goto LAB_001062e8;
  }
  minunit_status = '\0';
  labpack_writer_begin_str(writer,0x23);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    pcVar8 = "Failed to begin writing string in chunks";
    uVar4 = 0x1a6;
LAB_001063d9:
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_begin_and_end_str_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,uVar4,pcVar8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_001063ed:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    labpack_write_bytes(writer,"It\'s like JSON, but fast and small.",0x23);
    labpack_writer_end_str(writer);
    minunit_assert = minunit_assert + 1;
    cVar1 = labpack_writer_is_ok(writer);
    if (cVar1 == '\0') {
      pcVar8 = "Failed to end writing string in chunks";
      uVar4 = 0x1a9;
      goto LAB_001063d9;
    }
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_001063ed;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_writer_begin_bin(writer,4);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    pcVar8 = "Failed to begin writing binary blob in chunks";
    uVar4 = 0x1af;
LAB_00106562:
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_begin_and_end_bin_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,uVar4,pcVar8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00106576:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    labpack_write_bytes(writer,"",4);
    labpack_writer_end_bin(writer);
    minunit_assert = minunit_assert + 1;
    cVar1 = labpack_writer_is_ok(writer);
    if (cVar1 == '\0') {
      pcVar8 = "Failed to end writing binary blob in chunks";
      uVar4 = 0x1b2;
      goto LAB_00106562;
    }
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00106576;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_writer_begin_ext(writer,2,4);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    pcVar8 = "Failed to begin writing extension type in chunks";
    uVar4 = 0x1b8;
LAB_001066ee:
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_begin_and_end_ext_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,uVar4,pcVar8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00106702:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    labpack_write_bytes(writer,"",4);
    labpack_writer_end_ext(writer);
    minunit_assert = minunit_assert + 1;
    cVar1 = labpack_writer_is_ok(writer);
    if (cVar1 == '\0') {
      pcVar8 = "Failed to end writing extension type in chunks";
      uVar4 = 0x1bb;
      goto LAB_001066ee;
    }
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00106702;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_writer_begin_str(writer,0x23);
  labpack_write_bytes(writer,"It\'s like JSON, but fast and small.",0x23);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_bytes_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x1c2,"Failed to write bytes");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00106836:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    labpack_writer_end_str(writer);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00106836;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_writer_begin_str(writer,0x23);
  labpack_write_bytes(writer,0,0x23);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_error(writer);
  if (cVar1 == '\0') {
    pcVar8 = "Succeeds when it should have failed";
    uVar4 = 0x1ca;
LAB_001069a7:
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s",
             "test_write_bytes_errors_with_wrong_count",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,uVar4,pcVar8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_001069bb:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar2 = labpack_writer_status(writer);
    if (iVar2 != 2) {
      pcVar8 = "Not correct status";
      uVar4 = 0x1cb;
      goto LAB_001069a7;
    }
    putchar(0x2e);
    labpack_writer_end_str(writer);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_001069bb;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    (*minunit_setup)();
  }
  minunit_status = '\0';
  labpack_writer_begin_str(writer,0x23);
  labpack_write_bytes(writer,"It\'s like JSON, but fast and small.",0x23);
  labpack_writer_end_type(writer,6);
  minunit_assert = minunit_assert + 1;
  cVar1 = labpack_writer_is_ok(writer);
  if (cVar1 == '\0') {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_end_type_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/writer.c"
             ,0x1d4,"Failed to end type");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
  }
  else {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status != '\x01') goto LAB_00106b15;
  }
  minunit_fail = minunit_fail + 1;
  putchar(0x46);
  printf("\n%s\n",minunit_last_message);
LAB_00106b15:
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    (*minunit_teardown)();
  }
  minunit_setup = (_func_void *)0x0;
  minunit_teardown = (_func_void *)0x0;
  printf("\n\n%d tests, %d assertions, %d failures\n",(ulong)(uint)minunit_run,
         (ulong)(uint)minunit_assert,(ulong)(uint)minunit_fail);
  dVar6 = mu_timer_real();
  dVar7 = mu_timer_cpu();
  printf("\nFinished in %.8f seconds (real) %.8f seconds (proc)\n\n",dVar6 - minunit_real_timer,
         dVar7 - minunit_proc_timer);
  return minunit_fail;
}

Assistant:

int 
main(int argc, char* argv[]) 
{
    MU_RUN_SUITE(writer_create_and_destroy);
    MU_RUN_SUITE(writer_begin_and_end);
    MU_RUN_SUITE(writer_buffer);
    MU_RUN_SUITE(writer_status);
    MU_RUN_SUITE(write_types);
    MU_RUN_SUITE(arrays_and_maps);
    MU_RUN_SUITE(data_helpers);
    MU_RUN_SUITE(chunked_data);
	MU_REPORT();
	return minunit_fail;
}